

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O1

Vec_Ptr_t * Abc_NtkDfsReverseNodes(Abc_Ntk_t *pNtk,Abc_Obj_t **ppNodes,int nNodes)

{
  int iVar1;
  Abc_Ntk_t *pAVar2;
  uint uVar3;
  int *piVar4;
  Vec_Ptr_t *vNodes;
  void **__s;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar5;
  long lVar6;
  ulong uVar7;
  Abc_Obj_t *pAVar8;
  int iVar9;
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcDfs.c"
                  ,299,"Vec_Ptr_t *Abc_NtkDfsReverseNodes(Abc_Ntk_t *, Abc_Obj_t **, int)");
  }
  if ((pNtk->vTravIds).pArray == (int *)0x0) {
    iVar1 = pNtk->vObjs->nSize;
    uVar7 = (long)iVar1 + 500;
    iVar9 = (int)uVar7;
    if ((pNtk->vTravIds).nCap < iVar9) {
      piVar4 = (int *)malloc(uVar7 * 4);
      (pNtk->vTravIds).pArray = piVar4;
      if (piVar4 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (pNtk->vTravIds).nCap = iVar9;
    }
    if (-500 < iVar1) {
      memset((pNtk->vTravIds).pArray,0,(uVar7 & 0xffffffff) << 2);
    }
    (pNtk->vTravIds).nSize = iVar9;
  }
  iVar1 = pNtk->nTravIds;
  pNtk->nTravIds = iVar1 + 1;
  if (0x3ffffffe < iVar1) {
    __assert_fail("p->nTravIds < (1<<30)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                  ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
  }
  uVar3 = Abc_AigLevel(pNtk);
  iVar1 = uVar3 + 1;
  vNodes = (Vec_Ptr_t *)malloc(0x10);
  iVar9 = 8;
  if (6 < uVar3) {
    iVar9 = iVar1;
  }
  vNodes->nSize = 0;
  vNodes->nCap = iVar9;
  if (iVar9 == 0) {
    __s = (void **)0x0;
  }
  else {
    __s = (void **)malloc((long)iVar9 << 3);
  }
  vNodes->pArray = __s;
  vNodes->nSize = iVar1;
  memset(__s,0,(long)iVar1 << 3);
  if (0 < nNodes) {
    uVar7 = 0;
    uVar5 = extraout_RDX;
    do {
      pAVar8 = ppNodes[uVar7];
      uVar3 = *(uint *)&pAVar8->field_0x14 & 0xf;
      if ((uVar3 != 2) && (uVar3 != 5)) {
        __assert_fail("Abc_ObjIsCi(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcDfs.c"
                      ,0x133,"Vec_Ptr_t *Abc_NtkDfsReverseNodes(Abc_Ntk_t *, Abc_Obj_t **, int)");
      }
      pAVar2 = pAVar8->pNtk;
      iVar1 = pAVar2->nTravIds;
      iVar9 = pAVar8->Id;
      Vec_IntFillExtra(&pAVar2->vTravIds,iVar9 + 1,(int)uVar5);
      if (((long)iVar9 < 0) || ((pAVar2->vTravIds).nSize <= iVar9)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      (pAVar2->vTravIds).pArray[iVar9] = iVar1;
      if (pAVar8->pNtk->ntkType == ABC_NTK_NETLIST) {
        pAVar8 = (Abc_Obj_t *)pAVar8->pNtk->vObjs->pArray[*(pAVar8->vFanouts).pArray];
      }
      uVar5 = extraout_RDX_00;
      if (0 < (pAVar8->vFanouts).nSize) {
        lVar6 = 0;
        do {
          Abc_NtkDfsReverseNodes_rec
                    ((Abc_Obj_t *)pAVar8->pNtk->vObjs->pArray[(pAVar8->vFanouts).pArray[lVar6]],
                     vNodes);
          lVar6 = lVar6 + 1;
          uVar5 = extraout_RDX_01;
        } while (lVar6 < (pAVar8->vFanouts).nSize);
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != (uint)nNodes);
  }
  return vNodes;
}

Assistant:

Vec_Ptr_t * Abc_NtkDfsReverseNodes( Abc_Ntk_t * pNtk, Abc_Obj_t ** ppNodes, int nNodes )
{
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pObj, * pFanout;
    int i, k;
    assert( Abc_NtkIsStrash(pNtk) );
    // set the traversal ID
    Abc_NtkIncrementTravId( pNtk );
    // start the array of nodes
    vNodes = Vec_PtrStart( Abc_AigLevel(pNtk) + 1 );
    for ( i = 0; i < nNodes; i++ )
    {
        pObj = ppNodes[i];
        assert( Abc_ObjIsCi(pObj) );
        Abc_NodeSetTravIdCurrent( pObj );
        pObj = Abc_ObjFanout0Ntk(pObj);
        Abc_ObjForEachFanout( pObj, pFanout, k )
            Abc_NtkDfsReverseNodes_rec( pFanout, vNodes );
    }
    return vNodes;
}